

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

cmDocumentationEntry * cmGlobalGhsMultiGenerator::GetDocumentation(void)

{
  cmDocumentationEntry *in_RDI;
  allocator<char> local_11;
  
  GetActualName_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->Brief,
             "Generates Green Hills MULTI files (experimental, work-in-progress).",&local_11);
  in_RDI->CustomNamePrefix = ' ';
  return in_RDI;
}

Assistant:

cmDocumentationEntry cmGlobalGhsMultiGenerator::GetDocumentation()
{
  return {
    GetActualName(),
    "Generates Green Hills MULTI files (experimental, work-in-progress)."
  };
}